

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.h
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::Formatter::operator()
          (Formatter *this,char *format,int *args,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1)

{
  Printer *this_00;
  pointer pcVar1;
  long lVar2;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator_type local_91;
  char *local_90;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  string local_70;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  this_00 = this->printer_;
  local_90 = format;
  ToString<int,void>(&local_70,(Formatter *)(ulong)(uint)*args,(int)args);
  local_50[0] = local_40;
  pcVar1 = (args_1->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_50,pcVar1,pcVar1 + args_1->_M_string_length);
  __l._M_len = 2;
  __l._M_array = &local_70;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_88,__l,&local_91);
  io::Printer::FormatInternal(this_00,&local_88,&this->vars_,local_90);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_88);
  lVar2 = 0;
  do {
    if (local_40 + lVar2 != *(undefined1 **)((long)local_50 + lVar2)) {
      operator_delete(*(undefined1 **)((long)local_50 + lVar2));
    }
    lVar2 = lVar2 + -0x20;
  } while (lVar2 != -0x40);
  return;
}

Assistant:

void operator()(const char* format, const Args&... args) const {
    printer_->FormatInternal({ToString(args)...}, vars_, format);
  }